

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mipsdsp_accinsn(DisasContext_conflict6 *ctx,uint32_t op1,uint32_t op2,int ret,int v1,int v2
                        ,int check_ret)

{
  uint32_t uVar1;
  uint uVar2;
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  TCGv_i64 t;
  TCGv_i64 t_00;
  int ac_1;
  int ac;
  int shift;
  int16_t imm;
  TCGv_i64 v2_t;
  TCGv_i64 v1_t;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int v2_local;
  int v1_local;
  int ret_local;
  uint32_t op2_local;
  uint32_t op1_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ret != 0) || (check_ret != 1)) {
    ret_00 = tcg_temp_new_i64(tcg_ctx_00);
    ret_01 = tcg_temp_new_i64(tcg_ctx_00);
    t = tcg_temp_new_i64(tcg_ctx_00);
    t_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,t,v1);
    gen_load_gpr(tcg_ctx_00,t_00,v2);
    if (op1 == 0x7c000038) {
      check_dsp(ctx);
      if (op2 == 0x7c000038) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_extr_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000078) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_extr_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0000b8) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_extp(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0000f8) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_extp(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000138) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_extr_r_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c000178) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_extr_r_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0001b8) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_extr_rs_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0001f8) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_extr_rs_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0002b8) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_extpdp(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0002f8) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_extpdp(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0003b8) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_extr_s_h(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0003f8) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_extr_s_h(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0004b8) {
        tcg_gen_movi_i64_mips64el
                  (tcg_ctx_00,ret_00,(long)(short)((ushort)(ctx->opcode >> 0x10) & 0x3ff));
        gen_helper_rddsp(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0004f8) {
        tcg_gen_movi_i64_mips64el
                  (tcg_ctx_00,ret_00,(long)(short)((ushort)(ctx->opcode >> 0xb) & 0x3ff));
        gen_helper_wrdsp(tcg_ctx_00,t,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0006b8) {
        uVar1 = ctx->opcode;
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)ret);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)(short)((ushort)(uVar1 >> 0x14) & 0x3f));
        gen_helper_shilo(tcg_ctx_00,ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0006f8) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)ret);
        gen_helper_shilo(tcg_ctx_00,ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0007f8) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)ret);
        gen_helper_mthlip(tcg_ctx_00,ret_00,t,tcg_ctx_00->cpu_env);
      }
    }
    else if (op1 == 0x7c00003c) {
      check_dsp(ctx);
      if (op2 == 0x7c00003c) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_dextr_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c00007c) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_dextr_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0000bc) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_dextp(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0000fc) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_dextp(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c00013c) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_dextr_r_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c00017c) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_dextr_r_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0001bc) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_dextr_rs_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env)
        ;
      }
      else if (op2 == 0x7c0001fc) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_dextr_rs_w(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0002bc) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_dextpdp(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0002fc) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_dextpdp(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0003bc) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_dextr_s_h(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0003fc) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_dextr_s_h(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c00043c) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_dextr_l(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c00047c) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_dextr_l(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c00053c) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_dextr_r_l(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c00057c) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_dextr_r_l(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0005bc) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)v1);
        gen_helper_dextr_rs_l(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,ret_01,tcg_ctx_00->cpu_env)
        ;
      }
      else if (op2 == 0x7c0005fc) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)v2);
        gen_helper_dextr_rs_l(tcg_ctx_00,tcg_ctx_00->cpu_gpr[ret],ret_00,t,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0006bc) {
        uVar2 = ctx->opcode;
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)(int)(ctx->opcode >> 0x13 & 0x7f));
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_01,(long)(int)(uVar2 >> 0xb & 3));
        gen_helper_dshilo(tcg_ctx_00,ret_00,ret_01,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0006fc) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)(int)(ctx->opcode >> 0xb & 3));
        gen_helper_dshilo(tcg_ctx_00,t,ret_00,tcg_ctx_00->cpu_env);
      }
      else if (op2 == 0x7c0007fc) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,ret_00,(long)ret);
        gen_helper_dmthlip(tcg_ctx_00,t,ret_00,tcg_ctx_00->cpu_env);
      }
    }
    tcg_temp_free_i64(tcg_ctx_00,ret_00);
    tcg_temp_free_i64(tcg_ctx_00,ret_01);
    tcg_temp_free_i64(tcg_ctx_00,t);
    tcg_temp_free_i64(tcg_ctx_00,t_00);
  }
  return;
}

Assistant:

static void gen_mipsdsp_accinsn(DisasContext *ctx, uint32_t op1, uint32_t op2,
                                int ret, int v1, int v2, int check_ret)

{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv t1;
    TCGv v1_t;
    TCGv v2_t;
    int16_t imm;

    if ((ret == 0) && (check_ret == 1)) {
        /* Treat as NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);
    v1_t = tcg_temp_new(tcg_ctx);
    v2_t = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, v1_t, v1);
    gen_load_gpr(tcg_ctx, v2_t, v2);

    switch (op1) {
    case OPC_EXTR_W_DSP:
        check_dsp(ctx);
        switch (op2) {
        case OPC_EXTR_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extr_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTR_R_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extr_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTR_RS_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extr_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTR_S_H:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extr_s_h(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTRV_S_H:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extr_s_h(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTRV_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extr_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTRV_R_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extr_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTRV_RS_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extr_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTP:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTPV:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_EXTPDP:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_extpdp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_EXTPDPV:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_extpdp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_SHILO:
            imm = (ctx->opcode >> 20) & 0x3F;
            tcg_gen_movi_tl(tcg_ctx, t0, ret);
            tcg_gen_movi_tl(tcg_ctx, t1, imm);
            gen_helper_shilo(tcg_ctx, t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_SHILOV:
            tcg_gen_movi_tl(tcg_ctx, t0, ret);
            gen_helper_shilo(tcg_ctx, t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_MTHLIP:
            tcg_gen_movi_tl(tcg_ctx, t0, ret);
            gen_helper_mthlip(tcg_ctx, t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_WRDSP:
            imm = (ctx->opcode >> 11) & 0x3FF;
            tcg_gen_movi_tl(tcg_ctx, t0, imm);
            gen_helper_wrdsp(tcg_ctx, v1_t, t0, tcg_ctx->cpu_env);
            break;
        case OPC_RDDSP:
            imm = (ctx->opcode >> 16) & 0x03FF;
            tcg_gen_movi_tl(tcg_ctx, t0, imm);
            gen_helper_rddsp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, tcg_ctx->cpu_env);
            break;
        }
        break;
#ifdef TARGET_MIPS64
    case OPC_DEXTR_W_DSP:
        check_dsp(ctx);
        switch (op2) {
        case OPC_DMTHLIP:
            tcg_gen_movi_tl(tcg_ctx, t0, ret);
            gen_helper_dmthlip(tcg_ctx, v1_t, t0, tcg_ctx->cpu_env);
            break;
        case OPC_DSHILO:
            {
                int shift = (ctx->opcode >> 19) & 0x7F;
                int ac = (ctx->opcode >> 11) & 0x03;
                tcg_gen_movi_tl(tcg_ctx, t0, shift);
                tcg_gen_movi_tl(tcg_ctx, t1, ac);
                gen_helper_dshilo(tcg_ctx, t0, t1, tcg_ctx->cpu_env);
                break;
            }
        case OPC_DSHILOV:
            {
                int ac = (ctx->opcode >> 11) & 0x03;
                tcg_gen_movi_tl(tcg_ctx, t0, ac);
                gen_helper_dshilo(tcg_ctx, v1_t, t0, tcg_ctx->cpu_env);
                break;
            }
        case OPC_DEXTP:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);

            gen_helper_dextp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTPV:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTPDP:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextpdp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTPDPV:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextpdp(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_R_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_r_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_RS_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_rs_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_R_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_RS_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTR_S_H:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_s_h(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_S_H:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            tcg_gen_movi_tl(tcg_ctx, t1, v1);
            gen_helper_dextr_s_h(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, t1, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_R_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_r_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_RS_L:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_rs_l(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_R_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_r_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        case OPC_DEXTRV_RS_W:
            tcg_gen_movi_tl(tcg_ctx, t0, v2);
            gen_helper_dextr_rs_w(tcg_ctx, tcg_ctx->cpu_gpr[ret], t0, v1_t, tcg_ctx->cpu_env);
            break;
        }
        break;
#endif
    }

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, v1_t);
    tcg_temp_free(tcg_ctx, v2_t);
}